

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modern-coapp.hpp
# Opt level: O2

bytes_t * __thiscall coapp::pdu::to_bytes(bytes_t *__return_storage_ptr__,pdu *this)

{
  _Rb_tree_color _Var1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  _Rb_tree_color _Var3;
  uint uVar4;
  _Base_ptr p_Var5;
  pointer __src;
  int iVar6;
  size_t sVar7;
  pointer puVar8;
  uint uVar9;
  pointer puVar10;
  uint uVar11;
  ptrdiff_t _Num;
  anon_class_8_1_fd439fb2 encode_val;
  uint option_delta;
  bytes_t options_buf;
  anon_class_8_1_fd439fb2 local_80;
  int local_74;
  uint32_t local_70;
  uint local_6c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  pdu *local_48;
  bytes_t *local_40;
  _Rb_tree_node_base *local_38;
  
  sVar2 = (this->_payload)._M_string_length;
  iVar6 = 0;
  if (sVar2 != 0) {
    iVar6 = (int)sVar2 + 1;
  }
  iVar6 = (*(int *)&(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
          *(int *)&(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) + iVar6 + 4;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->_options)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_74 = iVar6;
    local_40 = __return_storage_ptr__;
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,0x400);
    local_38 = &(this->_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    _Var3 = _S_red;
    local_48 = this;
    while (p_Var5 != local_38) {
      _Var1 = p_Var5[1]._M_color;
      local_6c = _Var1 - _Var3;
      uVar11 = (uint)(byte)(0xe - (local_6c < 0x10d));
      if (local_6c < 0xd) {
        uVar11 = local_6c;
      }
      uVar4 = *(int *)&p_Var5[1]._M_left - *(int *)&p_Var5[1]._M_parent;
      uVar9 = (uint)(byte)(0xe - (uVar4 < 0x10d));
      if (uVar4 < 0xd) {
        uVar9 = uVar4;
      }
      local_80.options_buf._0_1_ = (byte_t)uVar11 << 4 | (byte)uVar9;
      Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
      emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
                 (uchar *)&local_80);
      local_80.options_buf = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68;
      to_bytes::anon_class_8_1_fd439fb2::operator()(&local_80,(byte_t)uVar11,&local_6c);
      local_70 = *(int *)&p_Var5[1]._M_left - *(int *)&p_Var5[1]._M_parent;
      to_bytes::anon_class_8_1_fd439fb2::operator()(&local_80,(byte)uVar9,&local_70);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((uchar *)p_Var5[1]._M_parent,(uchar *)p_Var5[1]._M_left,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      _Var3 = _Var1;
    }
    iVar6 = local_74 +
            ((int)local_68._M_impl.super__Vector_impl_data._M_finish -
            (int)local_68._M_impl.super__Vector_impl_data._M_start);
    this = local_48;
    __return_storage_ptr__ = local_40;
  }
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)iVar6,(allocator_type *)&local_80);
  iVar6._0_1_ = this->_version;
  iVar6._1_1_ = this->_type;
  iVar6._2_1_ = this->_code;
  iVar6._3_1_ = this->field_0x3;
  *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
   _M_impl.super__Vector_impl_data._M_start =
       (char)*(undefined4 *)
              &(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
       (char)*(undefined4 *)
              &(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start | this->_type << 4 | (byte)(iVar6 << 6);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[1] = this->_code;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = *(uchar *)((long)&this->_message_id + 1);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[3] = (uchar)this->_message_id;
  puVar8 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 4;
  __src = (this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar7 = (long)(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  puVar10 = __src;
  if (sVar7 != 0) {
    memmove(puVar8,__src,sVar7);
    __src = (this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish;
    puVar10 = (this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  puVar8 = puVar8 + ((long)__src - (long)puVar10);
  sVar7 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start;
  if (sVar7 != 0) {
    memmove(puVar8,local_68._M_impl.super__Vector_impl_data._M_start,sVar7);
    puVar8 = puVar8 + sVar7;
  }
  if ((this->_payload)._M_string_length != 0) {
    *puVar8 = 0xff;
    __first._M_current = (this->_payload)._M_dataplus._M_p;
    std::
    __copy_move_a<false,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + (this->_payload)._M_string_length),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar8 + 1));
  }
  Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_68);
  return __return_storage_ptr__;
}

Assistant:

bytes_t to_bytes() const
    {
        auto required_size = 4; // header length
        required_size += _token.size();

        if (auto pl_size = _payload.size())
            required_size += 1 /* separator */ + pl_size;

        // Encode Options
        bytes_t options_buf;
        if (_options.size()) {
            // Try to minimize allocations, options will typically fit in 1024 bytes
            // (does not increase vector size)
            options_buf.reserve(1024);

            auto prev_delta = 0;
            for (const auto& [number, value]: _options) {
                auto option_delta = number - prev_delta;
                prev_delta = number;

                auto get_nibble = [&] (const uint32_t& val) -> uint8_t {
                    if (val < 13)
                        return val;
                    if (val < 269)
                        return 13;
                    return 14;
                };

                byte_t delta_nibble = get_nibble(option_delta);
                byte_t length_nibble = get_nibble(value.size());
                options_buf.push_back((delta_nibble << 4) | length_nibble);

                auto encode_val = [&] (const byte_t nibble, const uint32_t& val) {
                    if (nibble < 13)
                        return; // already encoded in nibble

                    if (nibble == 13) {
                        options_buf.push_back(val - 13);
                    } else if (nibble == 14) {
                        auto encoded_val = val - 269;
                        assert(encoded_val <= std::numeric_limits<uint16_t>::max());
                        options_buf.push_back(encoded_val >> 8);
                        options_buf.push_back(encoded_val);
                    }
                };
                encode_val(delta_nibble, option_delta);
                encode_val(length_nibble, value.size());

                std::copy(value.begin(), value.end(),
                          std::back_inserter(options_buf));
            }

            required_size += options_buf.size();
        }

        bytes_t bytes(required_size);

        // Header
        bytes[0] = (_version << 6) | (_type << 4) | _token.size();
        bytes[1] = _code;
        bytes[2] = _message_id >> 8;
        bytes[3] = _message_id;

        // Token
        auto it = bytes.begin() + 4;
        std::copy(_token.begin(), _token.end(), it);
        it += _token.size();

        // Options
        if (auto s = options_buf.size()) {
            std::move(options_buf.begin(), options_buf.end(), it);
            it += s;
        }

        // Payload
        if (_payload.size()) {
            *it = 0xff;
            std::copy(_payload.begin(), _payload.end(), ++it);
        }

        return bytes;
    }